

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
          (DrawIndirectBase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferTest,
          uint widthTest,uint heightTest,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferRef,
          uint widthRef,uint heightRef)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  const_reference pvVar4;
  DILogger *pDVar5;
  float *pfVar6;
  long lVar7;
  DILogger local_3b0;
  undefined1 local_230 [8];
  DIResult status;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  int local_74;
  uint local_70;
  uint posXRef;
  uint j;
  uint offsetRef;
  uint offsetTest;
  uint i;
  double stepY;
  double stepX;
  Vec4 epsilon;
  PixelFormat *pixelFormat;
  uint widthRef_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferRef_local;
  uint heightTest_local;
  uint widthTest_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferTest_local;
  DrawIndirectBase *this_local;
  
  pRVar3 = deqp::Context::getRenderContext(*(Context **)(this + 0x20));
  iVar2 = (*pRVar3->_vptr_RenderContext[4])();
  epsilon.m_data._8_8_ =
       tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&stepX,
             1.0 / (float)(1 << ((byte)((PixelFormat *)epsilon.m_data._8_8_)->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)((PixelFormat *)epsilon.m_data._8_8_)->greenBits & 0x1f)),
             1.0 / (float)(1 << ((byte)((PixelFormat *)epsilon.m_data._8_8_)->blueBits & 0x1f)),
             1.0 / (float)(1 << ((byte)((PixelFormat *)epsilon.m_data._8_8_)->alphaBits & 0x1f)));
  stepY = (double)widthRef / (double)widthTest;
  _offsetTest = (double)heightRef / (double)heightTest;
  offsetRef = 0;
  do {
    if (heightTest <= offsetRef) {
      return 0;
    }
    j = offsetRef * widthTest;
    posXRef = (int)((double)offsetRef * _offsetTest + 0.5) * widthRef;
    for (local_70 = 0; local_70 < widthTest; local_70 = local_70 + 1) {
      local_74 = (int)((double)local_70 * stepY + 0.5);
      pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](bufferTest,(ulong)(local_70 + j));
      tcu::Vector<float,_4>::Vector(&local_84,pvVar4);
      pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](bufferRef,(ulong)(local_74 + posXRef));
      tcu::Vector<float,_4>::Vector(&local_94,pvVar4);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)&status.status_ + 4),(Vector<float,_4> *)&stepX);
      bVar1 = ColorVerify<tcu::Vector<float,4>>
                        (this,&local_84,&local_94,(Vec4 *)((long)&status.status_ + 4));
      if (!bVar1) {
        glcts::anon_unknown_0::DIResult::DIResult((DIResult *)local_230);
        glcts::anon_unknown_0::DIResult::error(&local_3b0,(DIResult *)local_230);
        pDVar5 = DILogger::operator<<((DILogger *)&local_3b0,(char (*) [9])"(x,y)= (");
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,&local_70);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,&offsetRef);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [15])"). Color RGBA(");
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferTest,(ulong)(local_70 + j));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,0);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferTest,(ulong)(local_70 + j));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,1);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferTest,(ulong)(local_70 + j));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,2);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferTest,(ulong)(local_70 + j));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,3);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<
                           ((DILogger *)pDVar5,(char (*) [35])") is different than expected RGBA(");
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferRef,(ulong)(local_74 + posXRef));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,0);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferRef,(ulong)(local_74 + posXRef));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,1);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferRef,(ulong)(local_74 + posXRef));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,2);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2c6b075);
        pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](bufferRef,(ulong)(local_74 + posXRef));
        pfVar6 = tcu::Vector<float,_4>::operator[](pvVar4,3);
        pDVar5 = DILogger::operator<<((DILogger *)pDVar5,pfVar6);
        DILogger::operator<<((DILogger *)pDVar5,(char (*) [2])0x2a94734);
        glcts::anon_unknown_0::DILogger::~DILogger(&local_3b0);
        lVar7 = glcts::anon_unknown_0::DIResult::code((DIResult *)local_230);
        glcts::anon_unknown_0::DIResult::~DIResult((DIResult *)local_230);
        return lVar7;
      }
    }
    offsetRef = offsetRef + 1;
  } while( true );
}

Assistant:

long BuffersCompare(const std::vector<T>& bufferTest, unsigned int widthTest, unsigned int heightTest,
						const std::vector<T>& bufferRef, unsigned int widthRef, unsigned int heightRef)
	{

		const tcu::PixelFormat& pixelFormat = m_context.getRenderContext().getRenderTarget().getPixelFormat();
		tcu::Vec4				epsilon		= tcu::Vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		double stepX = widthRef / static_cast<double>(widthTest);
		double stepY = heightRef / static_cast<double>(heightTest);
		for (unsigned int i = 0; i < heightTest; ++i)
		{
			unsigned int offsetTest = i * widthTest;
			unsigned int offsetRef  = static_cast<int>(i * stepY + 0.5) * widthRef;
			for (unsigned int j = 0; j < widthTest; ++j)
			{
				unsigned int posXRef = static_cast<int>(j * stepX + 0.5);
				if (!ColorVerify(bufferTest[j + offsetTest], bufferRef[posXRef + offsetRef], epsilon))
				{
					DIResult status;
					status.error() << "(x,y)= (" << j << "," << i << "). Color RGBA(" << bufferTest[j + offsetTest][0]
								   << "," << bufferTest[j + offsetTest][1] << "," << bufferTest[j + offsetTest][2]
								   << "," << bufferTest[j + offsetTest][3] << ") is different than expected RGBA("
								   << bufferRef[posXRef + offsetRef][0] << "," << bufferRef[posXRef + offsetRef][1]
								   << "," << bufferRef[posXRef + offsetRef][2] << ","
								   << bufferRef[posXRef + offsetRef][3] << ")";
					return status.code();
				}
			}
		}
		return NO_ERROR;
	}